

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

void __thiscall BoardView::SearchComponent(BoardView *this)

{
  ulong uVar1;
  Searcher *this_00;
  float fVar2;
  char cVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  ImGuiIO *pIVar11;
  ulong uVar12;
  char (*pacVar13) [128];
  bool dummy;
  pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
  results;
  string ui_number;
  string searchLabel;
  string title;
  byte local_159;
  bool local_149;
  undefined1 local_148 [8];
  ImVec2 local_140;
  undefined1 local_138 [16];
  pointer local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  char (*local_f8) [128];
  char (*local_f0) [128];
  char (*local_e8) [128];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
  local_60;
  
  local_149 = true;
  pIVar11 = ImGui::GetIO();
  fVar2 = (pIVar11->DisplaySize).x;
  iVar10 = DPI(100);
  local_148._4_4_ = (float)iVar10;
  local_148._0_4_ = fVar2 * 0.5;
  local_80._M_dataplus._M_p = (pointer)0x3f000000;
  ImGui::SetNextWindowPos((ImVec2 *)local_148,0,(ImVec2 *)&local_80);
  ImGui::PushStyleVar(4,1.0);
  bVar5 = ImGui::BeginPopupModal("Search for Component / Network",&local_149,0x160);
  if (bVar5) {
    bVar5 = this->m_showSearch;
    if (bVar5 == true) {
      this->m_showSearch = false;
    }
    pacVar13 = this->m_search;
    local_148._0_4_ = 0.0;
    local_148._4_4_ = 0.0;
    bVar6 = ImGui::Button("Search",(ImVec2 *)local_148);
    if (bVar6) {
      SearchCompound(this,*pacVar13);
      SearchCompoundNoClear(this,this->m_search[1]);
      SearchCompoundNoClear(this,this->m_search[2]);
      CenterZoomSearchResults(this);
      ImGui::CloseCurrentPopup();
    }
    local_f8 = this->m_search + 1;
    local_f0 = this->m_search + 2;
    ImGui::SameLine(0.0,-1.0);
    local_148._0_4_ = 0.0;
    local_148._4_4_ = 0.0;
    bVar6 = ImGui::Button("Reset",(ImVec2 *)local_148);
    if (bVar6) {
      FindComponent(this,"");
      this->m_search[0][0] = '\0';
      this->m_search[1][0] = '\0';
      this->m_search[2][0] = '\0';
      this->m_active_search_column = 0;
    }
    ImGui::SameLine(0.0,-1.0);
    local_148._0_4_ = 0.0;
    local_148._4_4_ = 0.0;
    bVar7 = ImGui::Button("Exit",(ImVec2 *)local_148);
    bVar6 = true;
    if (!bVar7) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"CloseDialog","");
      bVar6 = KeyBindings::isPressed(&this->keybindings,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar6 != false) {
      FindComponent(this,"");
      this->m_search[0][0] = '\0';
      this->m_search[1][0] = '\0';
      this->m_search[2][0] = '\0';
      this->m_active_search_column = 0;
      ImGui::CloseCurrentPopup();
    }
    ImGui::SameLine(0.0,-1.0);
    ImGui::PushItemWidth(-1.0);
    ImGui::Text("ENTER: Search, ESC: Exit, TAB: next field");
    ImGui::Separator();
    bVar6 = ImGui::Checkbox("Components",&this->m_searchComponents);
    ImGui::SameLine(0.0,-1.0);
    bVar7 = ImGui::Checkbox("Nets",&this->m_searchNets);
    ImGui::SameLine(0.0,-1.0);
    this_00 = &this->searcher;
    bVar8 = ImGui::Checkbox("Including details",&(this->searcher).m_search_details);
    ImGui::Text(" Search mode: ");
    ImGui::SameLine(0.0,-1.0);
    bVar9 = Searcher::isMode(this_00,Sub);
    bVar9 = ImGui::RadioButton("Substring",bVar9);
    if (bVar9) {
      Searcher::setMode(this_00,Sub);
      local_159 = 1;
    }
    else {
      local_159 = bVar5 | ((bVar6 || bVar7) || bVar8);
    }
    ImGui::SameLine(0.0,-1.0);
    bVar5 = Searcher::isMode(this_00,Prefix);
    bVar5 = ImGui::RadioButton("Prefix",bVar5);
    if (bVar5) {
      Searcher::setMode(this_00,Prefix);
      local_159 = 1;
    }
    ImGui::SameLine(0.0,-1.0);
    ImGui::PushItemWidth(-1.0);
    bVar5 = Searcher::isMode(this_00,Whole);
    bVar5 = ImGui::RadioButton("Whole",bVar5);
    if (bVar5) {
      Searcher::setMode(this_00,Whole);
      local_159 = 1;
    }
    ImGui::PopItemWidth();
    ImGui::Separator();
    ImGui::Columns(3,(char *)0x0,true);
    uVar12 = 0;
    local_e8 = pacVar13;
    do {
      uVar1 = uVar12 + 1;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_118,'\x01');
      std::__detail::__to_chars_10_impl<unsigned_int>(local_118._M_dataplus._M_p,1,(uint)uVar1);
      std::operator+(&local_a0,"Item #",&local_118);
      std::operator+(&local_c0,"##search",&local_118);
      ImGui::Text("%s",local_a0._M_dataplus._M_p);
      ImGui::PushItemWidth(-1.0);
      cVar3 = (*pacVar13)[0];
      SearchPartsAndNets((pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
                          *)local_148,this,*pacVar13,0x1e);
      bVar5 = local_128 == (pointer)local_138._8_8_;
      bVar6 = (ImVec2)local_148 == local_140;
      if ((bVar5 && bVar6) && cVar3 != '\0') {
        ImGui::PushStyleColor(7,0xff6666ff);
      }
      bVar7 = ImGui::InputText(local_c0._M_dataplus._M_p,*pacVar13,0x80,0x1010,
                               (ImGuiInputTextCallback)0x0,(void *)0x0);
      if ((bVar5 && bVar6) && cVar3 != '\0') {
        ImGui::PopStyleColor(1);
      }
      bVar5 = ImGui::IsItemActivated();
      iVar10 = (int)uVar12;
      if (bVar5) {
        this->m_active_search_column = iVar10;
        local_159 = 1;
      }
      uVar4 = this->m_active_search_column;
      if ((bVar7) || (((local_159 ^ 1) & 1) == 0 && uVar12 == uVar4)) {
        SearchCompound(this,*pacVar13);
      }
      ImGui::PopItemWidth();
      bVar5 = ImGui::IsItemDeactivated();
      if ((((!bVar5 && uVar12 == uVar4) && (bVar5 = ImGui::IsWindowFocused(3), bVar5)) &&
          (bVar5 = ImGui::IsAnyItemActive(), !bVar5)) &&
         (bVar5 = ImGui::IsMouseClicked(0,false), !bVar5)) {
        ImGui::SetKeyboardFocusHere(-1);
      }
      ImGui::PushItemWidth(-1.0);
      if (cVar3 != '\0') {
        std::operator+(&local_e0,"##SC",&local_118);
        std::
        pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
        ::pair(&local_60,
               (pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
                *)local_148);
        SearchColumnGenerate(this,&local_e0,&local_60,*pacVar13,0x1e);
        std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector
                  (&local_60.second);
        std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
        ~vector(&local_60.first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
      }
      ImGui::PopItemWidth();
      if (iVar10 == 2) {
        ImGui::PopItemWidth();
      }
      else if (iVar10 == 1) {
        iVar10 = DPI(500);
        ImGui::PushItemWidth((float)iVar10);
      }
      ImGui::NextColumn();
      std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector
                ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
                 (local_138 + 8));
      std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
                ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *
                 )local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      pacVar13 = pacVar13 + 1;
      uVar12 = uVar1;
    } while (uVar1 != 3);
    ImGui::PopItemWidth();
    ImGui::Columns(1,(char *)0x0,true);
    ImGui::Separator();
    local_148 = (undefined1  [8])local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"Accept","");
    bVar5 = KeyBindings::isPressed(&this->keybindings,(string *)local_148);
    pacVar13 = local_e8;
    if (local_148 != (undefined1  [8])local_138) {
      operator_delete((void *)local_148,(ulong)(local_138._0_8_ + 1));
    }
    if (bVar5) {
      SearchCompound(this,*pacVar13);
      SearchCompoundNoClear(this,*local_f8);
      SearchCompoundNoClear(this,*local_f0);
      CenterZoomSearchResults(this);
      ImGui::CloseCurrentPopup();
    }
    ImGui::EndPopup();
  }
  ImGui::PopStyleVar(1);
  return;
}

Assistant:

void BoardView::SearchComponent(void) {
	bool dummy = true;
	ImGui::SetNextWindowPos(ImVec2(ImGui::GetIO().DisplaySize.x/2, DPI(100)), 0, ImVec2(0.5f, 0.0f));
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	if (ImGui::BeginPopupModal("Search for Component / Network",
	                           &dummy,
	                           ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoSavedSettings)) {
		//		char cs[128];
		const char *first_button[] = {m_search[0], m_search[1], m_search[2]};

		bool search_params_changed = m_showSearch; //treat initiail popup reopening similar to later search option changes
		if (m_showSearch) {
			m_showSearch       = false;
			//			fprintf(stderr, "Tooltips disabled\n");
		}

		// Column 1, implied.
		//
		//
		if (ImGui::Button("Search")) {
			// FindComponent(first_button);
			SearchCompound(first_button[0]);
			SearchCompoundNoClear(first_button[1]);
			SearchCompoundNoClear(first_button[2]);
			CenterZoomSearchResults();
			ImGui::CloseCurrentPopup();
		} // search button

		ImGui::SameLine();
		if (ImGui::Button("Reset")) {
			FindComponent("");
			ResetSearch();
		} // reset button

		ImGui::SameLine();
		if (ImGui::Button("Exit") || keybindings.isPressed("CloseDialog")) {
			FindComponent("");
			ResetSearch();
			ImGui::CloseCurrentPopup();
		} // exit button

		ImGui::SameLine();
		//		ImGui::Dummy(ImVec2(DPI(200), 1));
		//		ImGui::SameLine();
		ImGui::PushItemWidth(-1);
		ImGui::Text("ENTER: Search, ESC: Exit, TAB: next field");

		{
			ImGui::Separator();
			search_params_changed |= ImGui::Checkbox("Components", &m_searchComponents);

			ImGui::SameLine();
			search_params_changed |= ImGui::Checkbox("Nets", &m_searchNets);

			ImGui::SameLine();
			search_params_changed |= ImGui::Checkbox("Including details", &searcher.configSearchDetails());

			ImGui::Text(" Search mode: ");
			ImGui::SameLine();
			if (ImGui::RadioButton("Substring", searcher.isMode(SearchMode::Sub))) {
				search_params_changed = true;
				searcher.setMode(SearchMode::Sub);
			}
			ImGui::SameLine();
			if (ImGui::RadioButton("Prefix", searcher.isMode(SearchMode::Prefix))) {
				search_params_changed = true;
				searcher.setMode(SearchMode::Prefix);
			}
			ImGui::SameLine();
			ImGui::PushItemWidth(-1);
			if (ImGui::RadioButton("Whole", searcher.isMode(SearchMode::Whole))) {
				search_params_changed = true;
				searcher.setMode(SearchMode::Whole);
			}
			ImGui::PopItemWidth();
		}

		ImGui::Separator();

		ImGui::Columns(3);

		for (int i = 0; i < 3; i++) {
			std::string ui_number   = std::to_string(i + 1); // visual UI number is 1-based unlike 0-based indexing
			std::string title       = "Item #" + ui_number;
			std::string searchLabel = "##search" + ui_number;
			ImGui::Text("%s", title.c_str());

			ImGui::PushItemWidth(-1);

			bool textNonEmpty = m_search[i][0] != '\0';                            // Text typed in the search box
			auto results      = SearchPartsAndNets(m_search[i], 30);               // Perform the search for both nets and parts
			bool hasResults   = !results.first.empty() || !results.second.empty(); // We found some nets or some parts

			if (textNonEmpty && !hasResults) ImGui::PushStyleColor(ImGuiCol_FrameBg, 0xFF6666FF);
			bool textChanged =
			    ImGui::InputText(searchLabel.c_str(),
			                     m_search[i],
			                     128,
			                     ImGuiInputTextFlags_CharsNoBlank | (m_search[0] ? ImGuiInputTextFlags_AutoSelectAll : 0));
			if (textNonEmpty && !hasResults) ImGui::PopStyleColor();
			if (ImGui::IsItemActivated()) {
				// user activates another column
				m_active_search_column = i;
				search_params_changed  = true;
			}

			bool this_column_active = i == m_active_search_column;

			if (textChanged || (search_params_changed && this_column_active)) SearchCompound(m_search[i]);

			ImGui::PopItemWidth();

			if (!ImGui::IsItemDeactivated() && this_column_active &&
			    ImGui::IsWindowFocused(ImGuiFocusedFlags_RootAndChildWindows) && !ImGui::IsAnyItemActive() &&
			    !ImGui::IsMouseClicked(0)) {
				ImGui::SetKeyboardFocusHere(-1);
			} // set keyboard focus back to active colun input-text after other type of element was clicked

			ImGui::PushItemWidth(-1);
			if (textNonEmpty) SearchColumnGenerate("##SC" + ui_number, results, m_search[i], 30);
			ImGui::PopItemWidth();
			if (i == 1)
				ImGui::PushItemWidth(DPI(500));
			else if (i == 2)
				ImGui::PopItemWidth();

			ImGui::NextColumn();
		}

		ImGui::PopItemWidth();

		ImGui::Columns(1); // reset back to single column mode
		ImGui::Separator();

		// Enter and Esc close the search:
		if (keybindings.isPressed("Accept")) {
			// SearchCompound(first_button);
			// SearchCompoundNoClear(first_button2);
			// SearchCompoundNoClear(first_button3);
			SearchCompound(m_search[0]);
			SearchCompoundNoClear(m_search[1]);
			SearchCompoundNoClear(m_search[2]);
			CenterZoomSearchResults();
			ImGui::CloseCurrentPopup();
		} // response to keyboard ENTER

		ImGui::EndPopup();
	}
	ImGui::PopStyleVar();
}